

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_init.c
# Opt level: O0

H264_StorePic_t * clone_storable_picture(H264dVideoCtx_t *p_Vid,H264_StorePic_t *p_pic)

{
  H264_StorePic_t *p_stored_pic;
  MPP_RET ret;
  H264_StorePic_t *p_pic_local;
  H264dVideoCtx_t *p_Vid_local;
  
  p_Vid_local = (H264dVideoCtx_t *)alloc_storable_picture(p_Vid,p_Vid->structure);
  if (p_Vid_local == (H264dVideoCtx_t *)0x0) {
    if ((h264d_debug & 1) != 0) {
      _mpp_log_l(4,"h264d_init","malloc buffer error(%d).\n",(char *)0x0,0x104);
    }
    p_Vid_local = (H264dVideoCtx_t *)0x0;
  }
  else {
    *(H264_Mem_type *)((long)p_Vid_local->spsSet + 0xd4) = Mem_Clone;
    p_Vid_local->spsSet[0x1b] = (h264_sps_t *)p_pic->mem_mark;
    dpb_mark_add_used((H264_DpbMark_t *)p_Vid_local->spsSet[0x1b],*(RK_S32 *)p_Vid_local->spsSet);
    *(RK_U8 *)((long)p_Vid_local->spsSet + 0x44) = '\x01';
    *(RK_S32 *)(p_Vid_local->spsSet + 3) = p_pic->pic_num;
    *(RK_U32 *)((long)p_Vid_local->spsSet + 0x24) = p_pic->frame_num;
    *(RK_S32 *)(p_Vid_local->spsSet + 4) = p_pic->long_term_frame_idx;
    *(RK_S32 *)((long)p_Vid_local->spsSet + 0x1c) = p_pic->long_term_pic_num;
    *(RK_U8 *)(p_Vid_local->spsSet + 5) = '\0';
    *(RK_S32 *)((long)p_Vid_local->spsSet + 0x34) = p_pic->non_existing;
    *(RK_S16 *)(p_Vid_local->spsSet + 7) = p_pic->max_slice_id;
    *(RK_S32 *)p_Vid_local->spsSet = p_pic->structure;
    *(RK_S32 *)((long)p_Vid_local->spsSet + 0x3c) = p_pic->mb_aff_frame_flag;
    *(RK_S32 *)((long)p_Vid_local->spsSet + 4) = p_pic->poc;
    *(RK_S32 *)(p_Vid_local->spsSet + 1) = p_pic->top_poc;
    *(RK_S32 *)((long)p_Vid_local->spsSet + 0xc) = p_pic->bottom_poc;
    *(RK_S32 *)(p_Vid_local->spsSet + 2) = p_pic->frame_poc;
    *(RK_U8 *)(p_Vid_local->spsSet + 0x18) = p_pic->is_mmco_5;
    *(RK_S32 *)((long)p_Vid_local->spsSet + 0xc4) = p_pic->poc_mmco5;
    *(RK_S32 *)(p_Vid_local->spsSet + 0x19) = p_pic->top_poc_mmco5;
    *(RK_S32 *)((long)p_Vid_local->spsSet + 0xcc) = p_pic->bot_poc_mmco5;
    *(RK_S32 *)(p_Vid_local->spsSet + 3) = p_pic->pic_num;
    *(RK_U32 *)((long)p_Vid_local->spsSet + 0x24) = p_pic->frame_num;
    *(RK_S32 *)(p_Vid_local->spsSet + 0xc) = p_pic->slice_type;
    *(RK_S32 *)((long)p_Vid_local->spsSet + 100) = p_pic->idr_flag;
    *(RK_S32 *)(p_Vid_local->spsSet + 0xd) = p_pic->no_output_of_prior_pics_flag;
    *(RK_S32 *)((long)p_Vid_local->spsSet + 0x6c) = 0;
    *(RK_S32 *)(p_Vid_local->spsSet + 0xe) = 0;
    p_Vid_local->spsSet[0x14] = (h264_sps_t *)0x0;
    *(RK_U32 *)(p_Vid_local->spsSet + 8) = p_pic->PicWidthInMbs;
    *(RK_S32 *)((long)p_Vid_local->spsSet + 0x74) = p_pic->chroma_format_idc;
    *(RK_S32 *)(p_Vid_local->spsSet + 0xf) = p_pic->frame_mbs_only_flag;
    *(RK_S32 *)((long)p_Vid_local->spsSet + 0x7c) = p_pic->frame_cropping_flag;
    if (*(RK_S32 *)((long)p_Vid_local->spsSet + 0x7c) != 0) {
      *(RK_S32 *)(p_Vid_local->spsSet + 0x10) = p_pic->frame_crop_left_offset;
      *(RK_S32 *)((long)p_Vid_local->spsSet + 0x84) = p_pic->frame_crop_right_offset;
      *(RK_S32 *)(p_Vid_local->spsSet + 0x11) = p_pic->frame_crop_top_offset;
      *(RK_S32 *)((long)p_Vid_local->spsSet + 0x8c) = p_pic->frame_crop_bottom_offset;
    }
    *(RK_S32 *)(p_Vid_local->spsSet + 0x16) = p_pic->inter_view_flag;
    *(RK_S32 *)((long)p_Vid_local->spsSet + 0xb4) = 0;
    *(RK_S32 *)((long)p_Vid_local->spsSet + 0xac) = p_pic->view_id;
    *(RK_S32 *)((long)p_Vid_local->spsSet + 0xbc) = p_pic->layer_id;
    *(RK_S32 *)(p_Vid_local->spsSet + 0x15) = 1;
    *(RK_S32 *)(p_Vid_local->spsSet + 6) = 1;
    *(RK_S32 *)((long)p_Vid_local->spsSet + 0x2c) = 1;
  }
  return (H264_StorePic_t *)p_Vid_local;
}

Assistant:

static H264_StorePic_t* clone_storable_picture(H264dVideoCtx_t *p_Vid, H264_StorePic_t *p_pic)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    H264_StorePic_t *p_stored_pic = alloc_storable_picture(p_Vid, p_Vid->structure);

    MEM_CHECK(ret, p_stored_pic);
    p_stored_pic->mem_malloc_type = Mem_Clone;
    p_stored_pic->mem_mark = p_pic->mem_mark;
    dpb_mark_add_used(p_stored_pic->mem_mark, p_stored_pic->structure);
    p_stored_pic->colmv_no_used_flag = 1;  // clone, colmv is not be used

    p_stored_pic->pic_num = p_pic->pic_num;
    p_stored_pic->frame_num = p_pic->frame_num;
    p_stored_pic->long_term_frame_idx = p_pic->long_term_frame_idx;
    p_stored_pic->long_term_pic_num = p_pic->long_term_pic_num;
    p_stored_pic->is_long_term = 0;
    p_stored_pic->non_existing = p_pic->non_existing;
    p_stored_pic->max_slice_id = p_pic->max_slice_id;
    p_stored_pic->structure = p_pic->structure;

    p_stored_pic->mb_aff_frame_flag = p_pic->mb_aff_frame_flag;
    p_stored_pic->poc = p_pic->poc;
    p_stored_pic->top_poc = p_pic->top_poc;
    p_stored_pic->bottom_poc = p_pic->bottom_poc;
    p_stored_pic->frame_poc = p_pic->frame_poc;
    p_stored_pic->is_mmco_5 = p_pic->is_mmco_5;
    p_stored_pic->poc_mmco5 = p_pic->poc_mmco5;
    p_stored_pic->top_poc_mmco5 = p_pic->top_poc_mmco5;
    p_stored_pic->bot_poc_mmco5 = p_pic->bot_poc_mmco5;
    p_stored_pic->pic_num = p_pic->pic_num;
    p_stored_pic->frame_num = p_pic->frame_num;
    p_stored_pic->slice_type = p_pic->slice_type;
    p_stored_pic->idr_flag = p_pic->idr_flag;
    p_stored_pic->no_output_of_prior_pics_flag = p_pic->no_output_of_prior_pics_flag;
    p_stored_pic->long_term_reference_flag = 0;
    p_stored_pic->adaptive_ref_pic_buffering_flag = 0;
    p_stored_pic->dec_ref_pic_marking_buffer = NULL;
    p_stored_pic->PicWidthInMbs = p_pic->PicWidthInMbs;

    p_stored_pic->chroma_format_idc = p_pic->chroma_format_idc;
    p_stored_pic->frame_mbs_only_flag = p_pic->frame_mbs_only_flag;
    p_stored_pic->frame_cropping_flag = p_pic->frame_cropping_flag;
    if (p_stored_pic->frame_cropping_flag) {
        p_stored_pic->frame_crop_left_offset = p_pic->frame_crop_left_offset;
        p_stored_pic->frame_crop_right_offset = p_pic->frame_crop_right_offset;
        p_stored_pic->frame_crop_top_offset = p_pic->frame_crop_top_offset;
        p_stored_pic->frame_crop_bottom_offset = p_pic->frame_crop_bottom_offset;
    }
    // MVC-related parameters
    p_stored_pic->inter_view_flag = p_pic->inter_view_flag;
    p_stored_pic->anchor_pic_flag = 0;
    p_stored_pic->view_id = p_pic->view_id;
    p_stored_pic->layer_id = p_pic->layer_id;
    p_stored_pic->proc_flag = 1;
    p_stored_pic->is_output = 1;
    p_stored_pic->used_for_reference = 1;

    return p_stored_pic;
__FAILED:
    (void)ret;
    return NULL;
}